

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O0

int get_random_number(int bits)

{
  uint16_t bit;
  int bits_local;
  
  random_register =
       (ushort)((int)(uint)random_register >> 1) |
       (random_register ^ (ushort)((int)(uint)random_register >> 1) ^
        (ushort)((int)(uint)random_register >> 3) ^ (ushort)((int)(uint)random_register >> 0xc)) <<
       0xf;
  return (int)(uint)random_register >> (0x10 - (byte)bits & 0x1f) & (1 << ((byte)bits & 0x1f)) - 1U;
}

Assistant:

static inline int get_random_number(int bits) {
  uint16_t bit;
  bit = ((random_register >> 0) ^ (random_register >> 1) ^
         (random_register >> 3) ^ (random_register >> 12)) &
        1;
  random_register = (random_register >> 1) | (bit << 15);
  return (random_register >> (16 - bits)) & ((1 << bits) - 1);
}